

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlcdnumber.cpp
# Opt level: O2

void __thiscall QLCDNumber::QLCDNumber(QLCDNumber *this,uint numDigits,QWidget *parent)

{
  QLCDNumberPrivate *this_00;
  QLCDNumberPrivate *this_01;
  
  this_01 = (QLCDNumberPrivate *)operator_new(0x2c0);
  QLCDNumberPrivate::QLCDNumberPrivate(this_01);
  QFrame::QFrame(&this->super_QFrame,(QFramePrivate *)this_01,parent,(WindowFlags)0x0);
  *(undefined ***)&(this->super_QFrame).super_QWidget = &PTR_metaObject_007cdd90;
  *(undefined ***)&(this->super_QFrame).super_QWidget.super_QPaintDevice = &PTR__QLCDNumber_007cdf48
  ;
  this_00 = *(QLCDNumberPrivate **)&(this->super_QFrame).super_QWidget.field_0x8;
  this_00->ndigits = numDigits;
  QLCDNumberPrivate::init(this_00,(EVP_PKEY_CTX *)this_01);
  return;
}

Assistant:

QLCDNumber::QLCDNumber(uint numDigits, QWidget *parent)
        : QFrame(*new QLCDNumberPrivate, parent)
{
    Q_D(QLCDNumber);
    d->ndigits = numDigits;
    d->init();
}